

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O0

ktx_error_code_e ktxTexture2_constructCommon(ktxTexture2 *This,ktx_uint32_t numLevels)

{
  undefined8 *puVar1;
  size_t __size;
  void *pvVar2;
  int in_ESI;
  undefined4 *in_RDI;
  ktx_size_t privateSize;
  ktx_error_code_e local_4;
  
  if (in_RDI != (undefined4 *)0x0) {
    *in_RDI = 2;
    *(ktxTexture_vtbl **)(in_RDI + 2) = &ktxTexture2_vtbl;
    puVar1 = *(undefined8 **)(in_RDI + 6);
    *puVar1 = ktxTexture2_vtblInt.calcDataSizeLevels;
    puVar1[1] = ktxTexture2_vtblInt.calcFaceLodSize;
    puVar1[2] = ktxTexture2_vtblInt.calcLevelOffset;
    __size = (ulong)(in_ESI - 1) * 0x18 + 0x38;
    pvVar2 = malloc(__size);
    *(void **)(in_RDI + 0x28) = pvVar2;
    if (*(long *)(in_RDI + 0x28) == 0) {
      local_4 = KTX_OUT_OF_MEMORY;
    }
    else {
      memset(*(void **)(in_RDI + 0x28),0,__size);
      local_4 = KTX_SUCCESS;
    }
    return local_4;
  }
  __assert_fail("This != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture2.c"
                ,0x17b,"ktx_error_code_e ktxTexture2_constructCommon(ktxTexture2 *, ktx_uint32_t)");
}

Assistant:

static KTX_error_code
ktxTexture2_constructCommon(ktxTexture2* This, ktx_uint32_t numLevels)
{
    assert(This != NULL);
    ktx_size_t privateSize;

    This->classId = ktxTexture2_c;
    This->vtbl = &ktxTexture2_vtbl;
    This->_protected->_vtbl = ktxTexture2_vtblInt;
    privateSize = sizeof(ktxTexture2_private)
                + sizeof(ktxLevelIndexEntry) * (numLevels - 1);
    This->_private = (ktxTexture2_private*)malloc(privateSize);
    if (This->_private == NULL) {
        return KTX_OUT_OF_MEMORY;
    }
    memset(This->_private, 0, privateSize);
    return KTX_SUCCESS;
}